

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

void __thiscall DOptionMenu::Ticker(DOptionMenu *this)

{
  FOptionMenuDescriptor *pFVar1;
  ulong uVar2;
  
  DMenu::Ticker(&this->super_DMenu);
  pFVar1 = this->mDesc;
  if ((pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) {
    uVar2 = 0;
    do {
      (*((pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar2]->
        super_FListMenuItem)._vptr_FListMenuItem[3])();
      uVar2 = uVar2 + 1;
      pFVar1 = this->mDesc;
    } while (uVar2 < (pFVar1->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count);
  }
  return;
}

Assistant:

void DOptionMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}